

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReportSection.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Data *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  QString *pQVar4;
  qsizetype qVar5;
  Element *pEVar6;
  undefined8 uVar7;
  QBrush *pQVar8;
  longlong __tmp;
  int iVar9;
  int iVar10;
  AlignmentFlag AVar11;
  int iVar12;
  int i;
  long lVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QStringList tocList;
  TableElement largeTableElement;
  PreviewDialog preview;
  QString tocText;
  Report report;
  QList<QTextOption::Tab> tabs;
  TextElement tocElement;
  TextElement pageCountElement;
  QApplication app;
  QColor headerColor;
  QArrayDataPointer<QString> local_188;
  QArrayDataPointer<char16_t> local_168;
  QArrayDataPointer<QTextOption::Tab> local_148 [2];
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QString local_d8;
  char *local_c0;
  QByteArrayView local_b8;
  QArrayDataPointer<QTextOption::Tab> local_a8;
  int local_84;
  QString local_80;
  QString local_68;
  QApplication local_50 [16];
  undefined4 local_40;
  undefined8 local_3c;
  undefined2 local_34;
  
  local_84 = argc;
  QApplication::QApplication(local_50,&local_84,argv,0x60204);
  KDReports::Report::Report((Report *)&local_d8,(QObject *)0x0);
  local_f8.d = (Data *)0x105030;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_188,(char **)&local_f8);
  QVar14.m_data = (storage_type *)local_188.d;
  QVar14.m_size = (qsizetype)local_148;
  QString::fromUtf8(QVar14);
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_168.size = local_148[0].size;
  local_148[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  QFont::QFont((QFont *)&local_118,(QString *)&local_168,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)&local_d8);
  QFont::~QFont((QFont *)&local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
  KDReports::Report::setFirstPageNumber((int)&local_d8);
  pEVar6 = (Element *)KDReports::Report::header(&local_d8,1);
  local_f8.d = (Data *)0x105036;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_118,(char **)&local_f8);
  QVar15.m_data = (storage_type *)local_118.d;
  QVar15.m_size = (qsizetype)local_148;
  QString::fromUtf8(QVar15);
  local_188.d = (Data *)CONCAT26(local_148[0].d._6_2_,
                                 CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_));
  local_188.ptr =
       (QString *)
       CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_188.size = local_148[0].size;
  local_148[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  KDReports::TextElement::TextElement((TextElement *)&local_168,(QString *)&local_188);
  KDReports::Header::addElement(pEVar6,(AlignmentFlag)&local_168);
  KDReports::TextElement::~TextElement((TextElement *)&local_168);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
  pEVar6 = (Element *)KDReports::Report::footer(&local_d8,6);
  local_f8.d = (Data *)0x105074;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_118,(char **)&local_f8);
  QVar16.m_data = (storage_type *)local_118.d;
  QVar16.m_size = (qsizetype)local_148;
  QString::fromUtf8(QVar16);
  local_188.d = (Data *)CONCAT26(local_148[0].d._6_2_,
                                 CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_));
  local_188.ptr =
       (QString *)
       CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_188.size = local_148[0].size;
  local_148[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  KDReports::TextElement::TextElement((TextElement *)&local_168,(QString *)&local_188);
  KDReports::Header::addElement(pEVar6,(AlignmentFlag)&local_168);
  KDReports::TextElement::~TextElement((TextElement *)&local_168);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
  local_f8.d = (Data *)0x1050a0;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_118,(char **)&local_f8);
  QVar17.m_data = (storage_type *)local_118.d;
  QVar17.m_size = (qsizetype)local_148;
  QString::fromUtf8(QVar17);
  local_188.d = (Data *)CONCAT26(local_148[0].d._6_2_,
                                 CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_));
  local_188.ptr =
       (QString *)
       CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_188.size = local_148[0].size;
  local_148[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  KDReports::TextElement::TextElement((TextElement *)&local_168,(QString *)&local_188);
  KDReports::Header::addElement(pEVar6,(AlignmentFlag)&local_168);
  KDReports::TextElement::~TextElement((TextElement *)&local_168);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
  local_f8.d = (Data *)0x1050a7;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_118,(char **)&local_f8);
  QVar18.m_data = (storage_type *)local_118.d;
  QVar18.m_size = (qsizetype)local_148;
  QString::fromUtf8(QVar18);
  local_188.d = (Data *)CONCAT26(local_148[0].d._6_2_,
                                 CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_));
  local_188.ptr =
       (QString *)
       CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_188.size = local_148[0].size;
  local_148[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  KDReports::TextElement::TextElement((TextElement *)&local_168,(QString *)&local_188);
  KDReports::Header::addInlineElement(pEVar6);
  KDReports::TextElement::~TextElement((TextElement *)&local_168);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
  KDReports::Header::addVariable((VariableType)pEVar6);
  local_f8.d = (Data *)0x1050a5;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_118,(char **)&local_f8);
  QVar19.m_data = (storage_type *)local_118.d;
  QVar19.m_size = (qsizetype)local_148;
  QString::fromUtf8(QVar19);
  local_188.d = (Data *)CONCAT26(local_148[0].d._6_2_,
                                 CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_));
  local_188.ptr =
       (QString *)
       CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_188.size = local_148[0].size;
  local_148[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  KDReports::TextElement::TextElement((TextElement *)&local_168,(QString *)&local_188);
  KDReports::Header::addInlineElement(pEVar6);
  KDReports::TextElement::~TextElement((TextElement *)&local_168);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_148[0].size = 0;
  KDReports::TextElement::TextElement((TextElement *)&local_68,(QString *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  local_168.d = (Data *)0x0;
  local_168.ptr = (char16_t *)0x0;
  local_168.size = 0;
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_188,"id_page_count",0xd);
  QVar20.m_data = (storage_type *)local_188.d;
  QVar20.m_size = (qsizetype)local_148;
  QString::fromLatin1(QVar20);
  qVar5 = local_168.size;
  pDVar1 = (Data *)CONCAT26(local_148[0].d._6_2_,CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_)
                           );
  local_148[0].d._0_4_ = SUB84(local_168.d,0);
  local_148[0].d._4_2_ = (undefined2)((ulong)local_168.d >> 0x20);
  local_148[0].d._6_2_ = (undefined2)((ulong)local_168.d >> 0x30);
  pcVar3 = (char16_t *)
           CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_168.size = local_148[0].size;
  local_148[0].ptr._0_4_ = SUB84(local_168.ptr,0);
  local_148[0].ptr._4_2_ = (undefined2)((ulong)local_168.ptr >> 0x20);
  local_148[0].ptr._6_2_ = (undefined2)((ulong)local_168.ptr >> 0x30);
  local_148[0].size = qVar5;
  local_168.d = pDVar1;
  local_168.ptr = pcVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  KDReports::TextElement::setId(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
  KDReports::Header::addInlineElement(pEVar6);
  local_a8.d = (Data *)0x0;
  local_a8.ptr = (Tab *)0x0;
  local_a8.size = 0;
  uVar7 = KDReports::Report::rightAlignedTab();
  local_148[0].d._4_2_ = (undefined2)extraout_XMM0_Db;
  local_148[0].d._6_2_ = (undefined2)((uint)extraout_XMM0_Db >> 0x10);
  local_148[0].ptr._0_4_ = (undefined4)uVar7;
  local_148[0].ptr._4_2_ = (undefined2)((ulong)uVar7 >> 0x20);
  local_148[0].d._0_4_ = extraout_XMM0_Da;
  QtPrivate::QMovableArrayOps<QTextOption::Tab>::emplace<QTextOption::Tab>
            ((QMovableArrayOps<QTextOption::Tab> *)&local_a8,local_a8.size,(Tab *)local_148);
  KDReports::Report::setTabPositions((QList *)&local_d8);
  local_118.d = (Data *)0x1050b7;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_188,(char **)&local_118);
  QVar21.m_data = (storage_type *)local_188.d;
  QVar21.m_size = (qsizetype)local_148;
  QString::fromUtf8(QVar21);
  local_168.d = (Data *)CONCAT26(local_148[0].d._6_2_,
                                 CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_));
  local_168.ptr =
       (char16_t *)
       CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_168.size = local_148[0].size;
  local_148[0].size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  KDReports::TextElement::TextElement((TextElement *)&local_80,(QString *)&local_168);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
  local_168.d = (Data *)0x0;
  local_168.ptr = (char16_t *)0x0;
  local_168.size = 0;
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_188,"id_toc",6);
  QVar22.m_data = (storage_type *)local_188.d;
  QVar22.m_size = (qsizetype)local_148;
  QString::fromLatin1(QVar22);
  qVar5 = local_168.size;
  pDVar1 = (Data *)CONCAT26(local_148[0].d._6_2_,CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_)
                           );
  local_148[0].d._0_4_ = SUB84(local_168.d,0);
  local_148[0].d._4_2_ = (undefined2)((ulong)local_168.d >> 0x20);
  local_148[0].d._6_2_ = (undefined2)((ulong)local_168.d >> 0x30);
  pcVar3 = (char16_t *)
           CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_168.size = local_148[0].size;
  local_148[0].ptr._0_4_ = SUB84(local_168.ptr,0);
  local_148[0].ptr._4_2_ = (undefined2)((ulong)local_168.ptr >> 0x20);
  local_148[0].ptr._6_2_ = (undefined2)((ulong)local_168.ptr >> 0x30);
  local_148[0].size = qVar5;
  local_168.d = pDVar1;
  local_168.ptr = pcVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  KDReports::TextElement::setId(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0xffff;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  KDReports::Report::addElement((Element *)&local_d8,(AlignmentFlag)&local_80,(QColor *)0x1);
  KDReports::Report::addVerticalSpacing(10.0);
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_148[0].size = 0;
  KDReports::Report::setTabPositions((QList *)&local_d8);
  QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(local_148);
  KDReports::TableElement::TableElement((TableElement *)&local_168);
  KDReports::TableElement::setHeaderRowCount((int)&local_168);
  KDReports::TableElement::setHeaderColumnCount((int)&local_168);
  KDReports::AbstractTableElement::setPadding(3.0);
  local_40 = 1;
  local_3c = 0xdadadadadadaffff;
  local_34 = 0;
  lVar13 = 1;
  do {
    pQVar8 = (QBrush *)KDReports::TableElement::cell((int)&local_168,0);
    QBrush::QBrush((QBrush *)local_148,&local_40,1);
    KDReports::Element::setBackground(pQVar8);
    QBrush::~QBrush((QBrush *)local_148);
    local_c0 = "Column %1";
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_b8,&local_c0);
    QVar23.m_data = (storage_type *)local_b8.m_size;
    QVar23.m_size = (qsizetype)local_148;
    QString::fromUtf8(QVar23);
    local_f8.d = (Data *)CONCAT26(local_148[0].d._6_2_,
                                  CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_));
    local_f8.ptr = (char16_t *)
                   CONCAT26(local_148[0].ptr._6_2_,
                            CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
    local_148[0].d._0_4_ = 0;
    local_148[0].d._4_2_ = 0;
    local_148[0].d._6_2_ = 0;
    local_148[0].ptr._0_4_ = 0;
    local_148[0].ptr._4_2_ = 0;
    local_148[0].ptr._6_2_ = 0;
    local_f8.size = local_148[0].size;
    local_148[0].size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
    QString::arg((longlong)&local_118,(int)&local_f8,(int)lVar13,(QChar)0x0);
    KDReports::TextElement::TextElement((TextElement *)&local_188,(QString *)&local_118);
    AVar11 = (AlignmentFlag)&local_188;
    KDReports::Cell::addElement((Element *)pQVar8,AVar11);
    KDReports::TextElement::~TextElement((TextElement *)&local_188);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 8);
  lVar13 = 1;
  do {
    pQVar8 = (QBrush *)KDReports::TableElement::cell((int)&local_168,(int)lVar13);
    QBrush::QBrush((QBrush *)local_148,&local_40,1);
    KDReports::Element::setBackground(pQVar8);
    QBrush::~QBrush((QBrush *)local_148);
    local_c0 = "Row %1";
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_b8,&local_c0);
    QVar24.m_data = (storage_type *)local_b8.m_size;
    QVar24.m_size = (qsizetype)local_148;
    QString::fromUtf8(QVar24);
    local_f8.d = (Data *)CONCAT26(local_148[0].d._6_2_,
                                  CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_));
    local_f8.ptr = (char16_t *)
                   CONCAT26(local_148[0].ptr._6_2_,
                            CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
    local_148[0].d._0_4_ = 0;
    local_148[0].d._4_2_ = 0;
    local_148[0].d._6_2_ = 0;
    local_148[0].ptr._0_4_ = 0;
    local_148[0].ptr._4_2_ = 0;
    local_148[0].ptr._6_2_ = 0;
    local_f8.size = local_148[0].size;
    local_148[0].size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
    QString::arg((longlong)&local_118,(int)&local_f8,(int)lVar13,(QChar)0x0);
    KDReports::TextElement::TextElement((TextElement *)&local_188,(QString *)&local_118);
    KDReports::Cell::addElement((Element *)pQVar8,AVar11);
    KDReports::TextElement::~TextElement((TextElement *)&local_188);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 300);
  iVar9 = 1;
  do {
    iVar12 = 1;
    iVar10 = iVar9;
    do {
      QString::number((int)local_148,iVar10);
      pEVar6 = (Element *)KDReports::TableElement::cell((int)&local_168,iVar12);
      KDReports::TextElement::TextElement((TextElement *)&local_188,(QString *)local_148);
      KDReports::Cell::addElement(pEVar6,AVar11);
      KDReports::TextElement::~TextElement((TextElement *)&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
      iVar12 = iVar12 + 1;
      iVar10 = iVar10 + 8;
    } while (iVar12 != 300);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 8);
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0xffff;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0;
  local_148[0].ptr._4_2_ = 0;
  KDReports::Report::addElement((Element *)&local_d8,(AlignmentFlag)&local_168,(QColor *)0x1);
  local_188.d = (Data *)0x0;
  local_188.ptr = (QString *)0x0;
  local_188.size = 0;
  QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_118,"id_page_count",0xd);
  QVar25.m_data = (storage_type *)local_118.d;
  QVar25.m_size = (qsizetype)local_148;
  QString::fromLatin1(QVar25);
  qVar5 = local_188.size;
  pDVar2 = (Data *)CONCAT26(local_148[0].d._6_2_,CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_)
                           );
  local_148[0].d._0_4_ = SUB84(local_188.d,0);
  local_148[0].d._4_2_ = (undefined2)((ulong)local_188.d >> 0x20);
  local_148[0].d._6_2_ = (undefined2)((ulong)local_188.d >> 0x30);
  pQVar4 = (QString *)
           CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_188.size = local_148[0].size;
  local_148[0].ptr._0_4_ = SUB84(local_188.ptr,0);
  local_148[0].ptr._4_2_ = (undefined2)((ulong)local_188.ptr >> 0x20);
  local_148[0].ptr._6_2_ = (undefined2)((ulong)local_188.ptr >> 0x30);
  local_148[0].size = qVar5;
  local_188.d = pDVar2;
  local_188.ptr = pQVar4;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  QString::number((int)local_148,500);
  KDReports::Report::associateTextValue(&local_d8,(QString *)&local_188);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_188);
  local_188.size = 0;
  local_188.d = (Data *)0x0;
  local_188.ptr = (QString *)0x0;
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0x10548c;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_148[0].size = 0x12;
  local_118.size = 0;
  local_118.d = (Data *)0x0;
  local_118.ptr = (char16_t *)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_188,0,(QString *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0x1054b2;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_148[0].size = 0x12;
  local_118.size = 0;
  local_118.d = (Data *)0x0;
  local_118.ptr = (char16_t *)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_188,local_188.size,(QString *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0x1054d8;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_148[0].size = 0x13;
  local_118.size = 0;
  local_118.d = (Data *)0x0;
  local_118.ptr = (char16_t *)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_188,local_188.size,(QString *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  local_148[0].d._0_4_ = 0;
  local_148[0].d._4_2_ = 0;
  local_148[0].d._6_2_ = 0;
  local_148[0].ptr._0_4_ = 0x105500;
  local_148[0].ptr._4_2_ = 0;
  local_148[0].ptr._6_2_ = 0;
  local_148[0].size = 1;
  local_f8.size = 0;
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  QtPrivate::QStringList_join((QList *)&local_118,(QChar *)&local_188,0x105500);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  local_f8.size = 0;
  QByteArrayView::QByteArrayView<char,_true>(&local_b8,"id_toc",6);
  QVar26.m_data = (storage_type *)local_b8.m_size;
  QVar26.m_size = (qsizetype)local_148;
  QString::fromLatin1(QVar26);
  qVar5 = local_f8.size;
  pDVar1 = (Data *)CONCAT26(local_148[0].d._6_2_,CONCAT24(local_148[0].d._4_2_,local_148[0].d._0_4_)
                           );
  local_148[0].d._0_4_ = SUB84(local_f8.d,0);
  local_148[0].d._4_2_ = (undefined2)((ulong)local_f8.d >> 0x20);
  local_148[0].d._6_2_ = (undefined2)((ulong)local_f8.d >> 0x30);
  pcVar3 = (char16_t *)
           CONCAT26(local_148[0].ptr._6_2_,CONCAT24(local_148[0].ptr._4_2_,local_148[0].ptr._0_4_));
  local_f8.size = local_148[0].size;
  local_148[0].ptr._0_4_ = SUB84(local_f8.ptr,0);
  local_148[0].ptr._4_2_ = (undefined2)((ulong)local_f8.ptr >> 0x20);
  local_148[0].ptr._6_2_ = (undefined2)((ulong)local_f8.ptr >> 0x30);
  local_148[0].size = qVar5;
  local_f8.d = pDVar1;
  local_f8.ptr = pcVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_148);
  KDReports::Report::associateTextValue(&local_d8,(QString *)&local_f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  KDReports::PreviewDialog::PreviewDialog
            ((PreviewDialog *)local_148,(Report *)&local_d8,(QWidget *)0x0);
  iVar9 = QDialog::exec();
  KDReports::PreviewDialog::~PreviewDialog((PreviewDialog *)local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_188);
  KDReports::TableElement::~TableElement((TableElement *)&local_168);
  KDReports::TextElement::~TextElement((TextElement *)&local_80);
  QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&local_a8);
  KDReports::TextElement::~TextElement((TextElement *)&local_68);
  KDReports::Report::~Report((Report *)&local_d8);
  QApplication::~QApplication(local_50);
  return iVar9;
}

Assistant:

int main(int argc, char **argv)
{
    QApplication app(argc, argv);

    KDReports::Report report;
    report.setDefaultFont(QFont("Arial", 8));

    report.setFirstPageNumber(100);

    KDReports::Header &header = report.header(KDReports::FirstPage);
    header.addElement(KDReports::TextElement("This is a test for generating one section of a larger report."));

    KDReports::Footer &footer = report.footer();
    footer.addElement(KDReports::TextElement("We are generating pages 100-109 out of 500."));
    footer.addElement(KDReports::TextElement("Page"), Qt::AlignRight);
    footer.addInlineElement(KDReports::TextElement(" "));
    footer.addVariable(KDReports::PageNumber);
    footer.addInlineElement(KDReports::TextElement(" / "));
    // As an example for combining reports together, we'll set the value of
    // the total page count later, when it's known.
    KDReports::TextElement pageCountElement;
    pageCountElement.setId(QLatin1String("id_page_count"));
    footer.addInlineElement(pageCountElement);

    QList<QTextOption::Tab> tabs;
    tabs.append(KDReports::Report::rightAlignedTab());
    report.setTabPositions(tabs);

    KDReports::TextElement tocElement("<Table of Contents will go here>");
    tocElement.setId(QLatin1String("id_toc"));
    report.addElement(tocElement);

    report.addVerticalSpacing(10);

    report.setTabPositions(QList<QTextOption::Tab>()); // for performance

    KDReports::TableElement largeTableElement = largeTable();
    report.addElement(largeTableElement);

    // Let's assume we know the total page count is 1000 now, let's set it.
    report.associateTextValue(QLatin1String("id_page_count"), QString::number(500));

    // Fill in the table of contents
    QStringList tocList;
    tocList << QStringLiteral("Chapter one\tpage 1");
    tocList << QStringLiteral("Chapter two\tpage 3");
    tocList << QStringLiteral("Last chapter\tpage 6");
    QString tocText = tocList.join(QStringLiteral("\n"));
    report.associateTextValue(QLatin1String("id_toc"), tocText);

    KDReports::PreviewDialog preview(&report);
    return preview.exec();

    // For performance testing...
    // report.exportToFile( "testout.pdf" );
    // return 0;
}